

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

int Cbs2_ManUpdateFrontier(Cbs2_Man_t *p,int iPropHeadOld,int *piDecLit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Gia_Obj_t *pGVar5;
  abctime aVar6;
  long lVar7;
  
  aVar4 = Abc_Clock();
  iVar1 = (p->pJust).iTail;
  *piDecLit = -1;
  if ((p->pProp).iHead == (p->pProp).iTail) {
    for (lVar7 = (long)(p->pJust).iHead;
        ((lVar7 < (p->pJust).iTail && (iVar3 = (p->pJust).pData[lVar7], iVar3 != 0)) &&
        (iVar1 != lVar7)); lVar7 = lVar7 + 1) {
      pGVar5 = Gia_ManObj(p->pAig,iVar3);
      iVar2 = Cbs2_VarIsJust(p,pGVar5,iVar3);
      if (iVar2 != 0) {
        Cbs2_QuePush(&p->pJust,iVar3);
      }
    }
    (p->pProp).iHead = iPropHeadOld;
    for (lVar7 = (long)iPropHeadOld;
        (iVar3 = (p->pProp).iTail, lVar7 < iVar3 && (iVar2 = (p->pProp).pData[lVar7], iVar2 != 0));
        lVar7 = lVar7 + 1) {
      iVar3 = Abc_Lit2Var(iVar2);
      pGVar5 = Gia_ManObj(p->pAig,iVar3);
      iVar2 = Cbs2_VarIsJust(p,pGVar5,iVar3);
      if (iVar2 != 0) {
        Cbs2_QuePush(&p->pJust,iVar3);
      }
    }
    (p->pProp).iHead = iVar3;
    (p->pJust).iHead = iVar1;
    aVar6 = Abc_Clock();
    p->timeJFront = p->timeJFront + (aVar6 - aVar4);
    return (int)((p->pJust).iHead == (p->pJust).iTail);
  }
  __assert_fail("Cbs2_QueIsEmpty(&p->pProp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                ,0x4bb,"int Cbs2_ManUpdateFrontier(Cbs2_Man_t *, int, int *)");
}

Assistant:

int Cbs2_ManUpdateFrontier( Cbs2_Man_t * p, int iPropHeadOld, int * piDecLit )
{
    abctime clk = Abc_Clock();
    int i, iVar, iLit, iJustTailOld = p->pJust.iTail;
    *piDecLit = -1;
    assert( Cbs2_QueIsEmpty(&p->pProp) );
    // visit old frontier nodes
    Cbs2_QueForEachEntry( p->pJust, iVar, i )
        if ( i == iJustTailOld )
            break;
        else if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
        {
            Cbs2_QuePush( &p->pJust, iVar );
            //*piDecLit = Cbs2_ManUpdateDecVar( p, iVar, *piDecLit );
        }
    // append new nodes
    p->pProp.iHead = iPropHeadOld;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
    {
        iVar = Abc_Lit2Var(iLit);
        if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
        {
            Cbs2_QuePush( &p->pJust, iVar );
            //*piDecLit = Cbs2_ManUpdateDecVar( p, iVar, *piDecLit );
        }
    }
    p->pProp.iHead = p->pProp.iTail;
    // update the head of the frontier
    p->pJust.iHead = iJustTailOld;
    // return 1 if the queue is empty
    p->timeJFront += Abc_Clock() - clk;
//printf( "%d ", p->pJust.iTail - p->pJust.iHead );
    return Cbs2_QueIsEmpty(&p->pJust);
}